

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

kwsysProcessTime kwsysProcessTimeGetCurrent(void)

{
  kwsysProcessTime kVar1;
  undefined1 local_28 [8];
  kwsysProcessTimeNative current_native;
  kwsysProcessTime current;
  
  gettimeofday((timeval *)local_28,(__timezone_ptr_t)0x0);
  kVar1.tv_usec = current_native.tv_sec;
  kVar1.tv_sec = (long)local_28;
  return kVar1;
}

Assistant:

static kwsysProcessTime kwsysProcessTimeGetCurrent(void)
{
  kwsysProcessTime current;
  kwsysProcessTimeNative current_native;
  gettimeofday(&current_native, 0);
  current.tv_sec = (long)current_native.tv_sec;
  current.tv_usec = (long)current_native.tv_usec;
  return current;
}